

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O3

bool __thiscall SectionHdrWrapper::reloadName(SectionHdrWrapper *this)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar6;
  storage_type *psVar7;
  long lVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QString local_58;
  QArrayData *local_38 [3];
  long *plVar5;
  
  iVar4 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  if (plVar5 != (long *)0x0) {
    plVar6 = (long *)this->name;
    if (plVar6 == (long *)0x0) {
      plVar6 = (long *)calloc(10,1);
      this->name = (char *)plVar6;
    }
    else if (*plVar6 == *plVar5) goto LAB_0012cfbb;
    *(undefined2 *)(plVar6 + 1) = 0;
    *plVar6 = 0;
    *(long *)this->name = *plVar5;
    if (this->name == (char *)0x0) {
      psVar7 = (storage_type *)0x0;
    }
    else {
      psVar7 = (storage_type *)strlen(this->name);
    }
    QVar9.m_data = psVar7;
    QVar9.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar9);
    pQVar1 = &((this->mappedName).d.d)->super_QArrayData;
    pcVar2 = (this->mappedName).d.ptr;
    (this->mappedName).d.d = local_58.d.d;
    (this->mappedName).d.ptr = local_58.d.ptr;
    qVar3 = (this->mappedName).d.size;
    (this->mappedName).d.size = local_58.d.size;
    lVar8 = local_58.d.size;
    local_58.d.d = (Data *)pQVar1;
    local_58.d.ptr = pcVar2;
    local_58.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
      lVar8 = (this->mappedName).d.size;
    }
    if (lVar8 == 0) {
      QString::number((ulong)local_38,(int)this->sectNum);
      QVar10.m_data = (storage_type *)0x1;
      QVar10.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar10);
      QString::append(&local_58);
      QString::operator=(&this->mappedName,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_38[0] != (QArrayData *)0x0) {
        LOCK();
        (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_38[0],2,8);
        }
      }
    }
  }
LAB_0012cfbb:
  return plVar5 != (long *)0x0;
}

Assistant:

bool SectionHdrWrapper::reloadName()
{
    IMAGE_SECTION_HEADER* header = (IMAGE_SECTION_HEADER*) getPtr();
    if (!header) return false;

    if (this->name) {
        if (memcmp(this->name, header->Name, SECNAME_LEN) == 0) {
            return true; //no need to reload
        }
    }
    const size_t BUF_LEN = SECNAME_LEN + 2;
    if (!this->name) {
        this->name = (char*)::calloc(BUF_LEN, 1);
    }
    ::memset(this->name, 0, BUF_LEN);
    ::memcpy(this->name, header->Name, SECNAME_LEN);
    this->mappedName = this->name;
    if (this->mappedName.length() == 0) {
        this->mappedName = "#" + QString::number(this->sectNum, 10);
    }
    return true;
}